

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coop.c
# Opt level: O3

void thread_start(Sched *sched,_func_void *func)

{
  int iVar1;
  Thread *pTVar2;
  Thread *pTVar3;
  Thread *arg;
  void *args_dest;
  undefined8 *local_30;
  
  arg = (Thread *)malloc(0x80);
  arg->sched = sched;
  iVar1 = sched->next_id;
  sched->next_id = iVar1 + 1;
  arg->id = iVar1;
  fiber_alloc(&arg->fiber,0x4000,thread_guard,arg,8);
  fiber_reserve_return(&arg->fiber,thread_exec,&local_30,0x10);
  *local_30 = arg;
  local_30[1] = func;
  pTVar2 = sched->running;
  pTVar3 = pTVar2->next;
  arg->next = pTVar3;
  arg->prev = pTVar2;
  pTVar3->prev = arg;
  arg->prev->next = arg;
  return;
}

Assistant:

static void
thread_start(Sched *sched, void (*func)(void))
{
    Thread *th = hu_cxx_static_cast(Thread *, malloc(sizeof *th));
    th->sched = sched;
    th->id = sched->next_id++;
    (void) fiber_alloc(
      &th->fiber, STACK_SIZE, thread_guard, th, FIBER_FLAG_GUARD_LO);

    ThreadArgs args;
    args.thread = th;
    args.entry = func;
    fiber_push_return(&th->fiber, thread_exec, &args, sizeof args);

    th->next = sched->running->next;
    th->prev = sched->running;
    th->next->prev = th;
    th->prev->next = th;
}